

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O3

MPP_RET hal_h264e_vepu510_ret_task(void *hal,HalEncTask *task)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  EncRcTask *pEVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  RK_U32 RVar18;
  int iVar19;
  long lVar20;
  
  uVar16 = *(int *)(*(long *)((long)hal + 0x60) + 0x40) *
           *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  pEVar11 = task->rc_task;
  lVar1 = *(long *)((long)hal + 0x140) + (long)(task->flags).reg_idx * 0xe90;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","enter %p\n","hal_h264e_vepu510_ret_task",hal);
  }
  *(uint *)((long)hal + 0x2c8) = uVar16;
  iVar13 = (*(uint *)(lVar1 + 0xab0) & 0xff) * 4;
  *(int *)((long)hal + 0x2d0) = iVar13;
  bVar2 = *(byte *)(lVar1 + 0xab1);
  *(uint *)((long)hal + 0x2d4) = (uint)bVar2 * 4;
  bVar3 = *(byte *)(lVar1 + 0xab2);
  *(uint *)((long)hal + 0x2d8) = (uint)bVar3 * 4;
  bVar4 = *(byte *)(lVar1 + 0xab3);
  *(uint *)((long)hal + 0x2dc) = (uint)bVar4 * 4;
  *(uint *)((long)hal + 0x2e0) = iVar13 + (uint)bVar2 * 4 + (uint)bVar3 * 4 + (uint)bVar4 * 4;
  *(undefined4 *)((long)hal + 0x1b4) = *(undefined4 *)(*(long *)((long)hal + 0x188) + 0x2c);
  task->length = task->length + task->hw_length;
  iVar13 = task->hw_length << 3;
  (pEVar11->info).bit_real = iVar13;
  uVar14 = *(uint *)(lVar1 + 0xa18) / uVar16;
  (pEVar11->info).quality_real = uVar14;
  uVar16 = (((*(uint *)(lVar1 + 0xaa0) & 0x1fffff) +
            (*(uint *)(lVar1 + 0xaa4) & 0x7fffff) + (*(uint *)(lVar1 + 0xaa8) & 0x7fffff)) * 0x100)
           / uVar16;
  (pEVar11->info).iblk4_prop = uVar16;
  (pEVar11->info).sse = (ulong)*(uint6 *)(lVar1 + 0xa12);
  (pEVar11->info).lvl16_inter_num = *(uint *)(lVar1 + 0xa94) & 0x1fffff;
  (pEVar11->info).lvl8_inter_num = *(uint *)(lVar1 + 0xa98) & 0x7fffff;
  (pEVar11->info).lvl16_intra_num = *(uint *)(lVar1 + 0xaa0) & 0x1fffff;
  (pEVar11->info).lvl8_intra_num = *(uint *)(lVar1 + 0xaa4) & 0x7fffff;
  (pEVar11->info).lvl4_intra_num = *(uint *)(lVar1 + 0xaa8) & 0x7fffff;
  *(int *)((long)hal + 0xb0) = iVar13;
  *(uint *)((long)hal + 0xb4) = uVar14;
  *(uint *)((long)hal + 0xc0) = uVar16;
  (task->hal_ret).data = (void *)((long)hal + 0x90);
  (task->hal_ret).number = 1;
  mpp_dev_multi_offset_reset(*(MppDevRegOffCfgs **)((long)hal + 0x38));
  if (*(H264eDpb **)((long)hal + 0x70) != (H264eDpb *)0x0) {
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).curr_idx);
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).refr_idx);
  }
  if (*(long **)((long)hal + 0x420) != (long *)0x0) {
    lVar1 = **(long **)((long)hal + 0x420);
    lVar12 = *(long *)(lVar1 + 0x140);
    uVar15 = *(int *)(*(long *)(lVar1 + 0x60) + 0x40) * *(int *)(*(long *)(lVar1 + 0x60) + 0x3c);
    lVar20 = (long)(task->flags).reg_idx * 0xe90;
    uVar16 = *(uint *)(lVar12 + 0xad0 + lVar20);
    uVar14 = *(uint *)(lVar12 + 0xad8 + lVar20);
    uVar5 = *(uint *)(lVar12 + 0xae0 + lVar20);
    uVar6 = *(uint *)(lVar12 + 0xae8 + lVar20);
    iVar17 = (uint)*(ushort *)(lVar12 + 0xb06 + lVar20) + (uint)*(ushort *)(lVar12 + 0xafe + lVar20)
             + (uint)*(ushort *)(lVar12 + 0xaf6 + lVar20) +
               (uint)*(ushort *)(lVar12 + 0xaee + lVar20);
    uVar7 = *(uint *)(lVar12 + 0xaf0 + lVar20);
    uVar8 = *(uint *)(lVar12 + 0xaf8 + lVar20);
    uVar9 = *(uint *)(lVar12 + 0xb00 + lVar20);
    uVar10 = *(uint *)(lVar12 + 0xb08 + lVar20);
    iVar13 = (uVar10 & 0xffff) + (uVar9 & 0xffff) + (uVar8 & 0xffff) + (uVar7 & 0xffff);
    iVar19 = (uVar10 >> 0x10) + (uVar9 >> 0x10) + (uVar8 >> 0x10) + (uVar7 >> 0x10);
    uVar16 = ((((uVar6 & 0xffff) + (uVar5 & 0xffff) + (uVar14 & 0xffff) + (uVar16 & 0xffff)) * 5 +
               ((uVar6 >> 0x10) + (uVar5 >> 0x10) + (uVar14 >> 0x10) + (uVar16 >> 0x10)) * 6 >> 2) +
             (uint)*(ushort *)(lVar12 + 0xae6 + lVar20) + (uint)*(ushort *)(lVar12 + 0xade + lVar20)
             + (uint)*(ushort *)(lVar12 + 0xad6 + lVar20) +
               (uint)*(ushort *)(lVar12 + 0xace + lVar20)) * 100;
    RVar18 = 2;
    if (uVar16 <= uVar15 * 0x1e) {
      RVar18 = (RK_U32)(uVar15 * 0xd < uVar16);
    }
    pEVar11 = task->rc_task;
    (pEVar11->info).complex_level = RVar18;
    if (*(int *)(lVar1 + 0x428) == 0) {
      uVar16 = iVar17 * 0x11 + iVar13 * 0x16 + iVar19 * 0x18;
    }
    else {
      uVar16 = iVar13 * 0xb + iVar17 * 8 + iVar19 * 0xc;
    }
    uVar16 = (uVar16 >> 2) * 100;
    RVar18 = 200;
    if ((uVar16 <= uVar15 * 0xf) && (RVar18 = 100, uVar16 <= uVar15 * 5)) {
      RVar18 = (RK_U32)(uVar15 >> 2 < uVar16);
    }
    (pEVar11->info).motion_level = RVar18;
    if ((hal_h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu510","complex_level %d motion_level %d\n",
                 "vepu510_h264e_tune_stat_update");
    }
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","leave %p\n","hal_h264e_vepu510_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu510_ret_task(void * hal, HalEncTask * task)
{
    HalH264eVepu510Ctx *ctx = (HalH264eVepu510Ctx *)hal;
    HalVepu510RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    Vepu510H264Fbk *fb = &ctx->feedback;
    Vepu510Status *reg_st = &regs->reg_st;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    fb->st_mb_num = mbs;
    fb->st_smear_cnt[0] = reg_st->st_smear_cnt.rdo_smear_cnt0 * 4;
    fb->st_smear_cnt[1] = reg_st->st_smear_cnt.rdo_smear_cnt1 * 4;
    fb->st_smear_cnt[2] = reg_st->st_smear_cnt.rdo_smear_cnt2 * 4;
    fb->st_smear_cnt[3] = reg_st->st_smear_cnt.rdo_smear_cnt3 * 4;
    fb->st_smear_cnt[4] = fb->st_smear_cnt[0] + fb->st_smear_cnt[1] +
                          fb->st_smear_cnt[2] + fb->st_smear_cnt[3];
    fb->frame_type = ctx->slice->slice_type;

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs->reg_st.qp_sum / mbs;
    rc_info->iblk4_prop = (regs->reg_st.st_pnum_i4.pnum_i4 +
                           regs->reg_st.st_pnum_i8.pnum_i8 +
                           regs->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs->reg_st.sse_h32 << 16) +
                   (regs->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    mpp_dev_multi_offset_reset(ctx->offsets);

    if (ctx->dpb) {
        h264e_dpb_hal_end(ctx->dpb, task->flags.curr_idx);
        h264e_dpb_hal_end(ctx->dpb, task->flags.refr_idx);
    }

    vepu510_h264e_tune_stat_update(ctx->tune, task);

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}